

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateMouseMovingWindowNewFrame(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImVec2 local_20;
  ImVec2 pos;
  ImGuiWindow *moving_window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  if (GImGui->MovingWindow == (ImGuiWindow *)0x0) {
    if (GImGui->ActiveIdWindow == (ImGuiWindow *)0x0) {
      return;
    }
    if (GImGui->ActiveIdWindow->MoveId != GImGui->ActiveId) {
      return;
    }
    KeepAliveID(GImGui->ActiveId);
    if (((pIVar1->IO).MouseDown[0] & 1U) != 0) {
      return;
    }
    ClearActiveID();
    return;
  }
  KeepAliveID(GImGui->ActiveId);
  bVar2 = false;
  if (pIVar1->MovingWindow != (ImGuiWindow *)0x0) {
    bVar2 = pIVar1->MovingWindow->RootWindow != (ImGuiWindow *)0x0;
  }
  if (!bVar2) {
    __assert_fail("g.MovingWindow && g.MovingWindow->RootWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xcbd,"void ImGui::UpdateMouseMovingWindowNewFrame()");
  }
  pos = (ImVec2)pIVar1->MovingWindow->RootWindow;
  if ((((pIVar1->IO).MouseDown[0] & 1U) == 0) ||
     (bVar2 = IsMousePosValid(&(pIVar1->IO).MousePos), !bVar2)) {
    ClearActiveID();
    pIVar1->MovingWindow = (ImGuiWindow *)0x0;
    return;
  }
  local_20 = ::operator-(&(pIVar1->IO).MousePos,&pIVar1->ActiveIdClickOffset);
  if ((*(float *)((long)pos + 0x10) == local_20.x) &&
     (!NAN(*(float *)((long)pos + 0x10)) && !NAN(local_20.x))) {
    if ((*(float *)((long)pos + 0x14) == local_20.y) &&
       (!NAN(*(float *)((long)pos + 0x14)) && !NAN(local_20.y))) goto LAB_00246699;
  }
  MarkIniSettingsDirty((ImGuiWindow *)pos);
  SetWindowPos((ImGuiWindow *)pos,&local_20,1);
LAB_00246699:
  FocusWindow(pIVar1->MovingWindow);
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowNewFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.MovingWindow != NULL)
    {
        // We actually want to move the root window. g.MovingWindow == window we clicked on (could be a child window).
        // We track it to preserve Focus and so that generally ActiveIdWindow == MovingWindow and ActiveId == MovingWindow->MoveId for consistency.
        KeepAliveID(g.ActiveId);
        IM_ASSERT(g.MovingWindow && g.MovingWindow->RootWindow);
        ImGuiWindow* moving_window = g.MovingWindow->RootWindow;
        if (g.IO.MouseDown[0] && IsMousePosValid(&g.IO.MousePos))
        {
            ImVec2 pos = g.IO.MousePos - g.ActiveIdClickOffset;
            if (moving_window->Pos.x != pos.x || moving_window->Pos.y != pos.y)
            {
                MarkIniSettingsDirty(moving_window);
                SetWindowPos(moving_window, pos, ImGuiCond_Always);
            }
            FocusWindow(g.MovingWindow);
        }
        else
        {
            ClearActiveID();
            g.MovingWindow = NULL;
        }
    }
    else
    {
        // When clicking/dragging from a window that has the _NoMove flag, we still set the ActiveId in order to prevent hovering others.
        if (g.ActiveIdWindow && g.ActiveIdWindow->MoveId == g.ActiveId)
        {
            KeepAliveID(g.ActiveId);
            if (!g.IO.MouseDown[0])
                ClearActiveID();
        }
    }
}